

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode Curl_pop3_write(connectdata *conn,char *str,size_t nread)

{
  int *piVar1;
  char cVar2;
  SessionHandle *pSVar3;
  char **ppcVar4;
  bool bVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  size_t sVar8;
  size_t sVar9;
  byte bVar10;
  size_t sVar11;
  long lVar12;
  size_t local_50;
  CURLcode local_44;
  
  pSVar3 = conn->data;
  if (nread == 0) {
    CVar7 = CURLE_OK;
    local_50 = 0;
  }
  else {
    sVar11 = 0;
    local_50 = 0;
    bVar10 = 0;
    CVar7 = CURLE_OK;
    do {
      ppcVar4 = (char **)(conn->proto).pop3c.eob;
      cVar2 = str[sVar11];
      sVar8 = local_50;
      if (cVar2 == '\n') {
        if ((ppcVar4 == (char **)0x4) || (ppcVar4 == (char **)0x1)) {
          sVar9 = (long)ppcVar4 + 1;
          goto LAB_00487b1e;
        }
LAB_00487b1c:
        sVar9 = 0;
LAB_00487b1e:
        (conn->proto).pop3c.eob = sVar9;
LAB_00487b25:
        local_50 = sVar8;
        bVar5 = true;
        if ((ppcVar4 != (char **)0x0) && ((conn->proto).ftpc.dirs <= ppcVar4)) {
          sVar8 = (conn->proto).pop3c.strip;
          lVar12 = -(long)ppcVar4;
          do {
            sVar8 = sVar8 - 1;
            if (sVar8 == 0xffffffffffffffff) {
              CVar6 = Curl_client_write(conn,1,"\r\n.\r\n",-((ulong)bVar10 + lVar12));
              CVar7 = CURLE_OK;
              if (CVar6 != CURLE_OK) goto LAB_00487b8c;
              bVar10 = 0;
              local_50 = sVar11;
              bVar5 = true;
              break;
            }
            (conn->proto).pop3c.strip = sVar8;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0);
        }
      }
      else {
        if (cVar2 == '.') {
          if (ppcVar4 == (char **)0x2) {
            sVar9 = 3;
            goto LAB_00487b1e;
          }
          if (ppcVar4 == (char **)0x3) {
            bVar10 = 1;
          }
          goto LAB_00487b1c;
        }
        if (cVar2 != '\r') goto LAB_00487b1c;
        if (ppcVar4 == (char **)0x3) {
          sVar9 = 4;
          goto LAB_00487b1e;
        }
        if (ppcVar4 != (char **)0x0) {
          sVar9 = 1;
          goto LAB_00487b1e;
        }
        (conn->proto).pop3c.eob = 1;
        if (sVar11 == 0) goto LAB_00487b25;
        CVar6 = Curl_client_write(conn,1,str + local_50,sVar11 - local_50);
        CVar7 = CURLE_OK;
        sVar8 = sVar11;
        if (CVar6 == CURLE_OK) goto LAB_00487b25;
LAB_00487b8c:
        local_44 = CVar6;
        CVar7 = CVar6;
        bVar5 = false;
      }
      if (!bVar5) {
        return local_44;
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != nread);
  }
  ppcVar4 = (conn->proto).ftpc.dirs;
  if (ppcVar4 == (char **)0x0) {
    if (nread - local_50 != 0) {
      CVar7 = Curl_client_write(conn,1,str + local_50,nread - local_50);
      return CVar7;
    }
  }
  else {
    CVar7 = CURLE_OK;
    if (ppcVar4 == (char **)0x5) {
      CVar7 = Curl_client_write(conn,1,"\r\n.\r\n",2);
      piVar1 = &(pSVar3->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
      (conn->proto).ftpc.dirs = (char **)0x0;
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_pop3_write(struct connectdata *conn, char *str, size_t nread)
{
  /* This code could be made into a special function in the handler struct */
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SingleRequest *k = &data->req;

  struct pop3_conn *pop3c = &conn->proto.pop3c;
  bool strip_dot = FALSE;
  size_t last = 0;
  size_t i;

  /* Search through the buffer looking for the end-of-body marker which is
     5 bytes (0d 0a 2e 0d 0a). Note that a line starting with a dot matches
     the eob so the server will have prefixed it with an extra dot which we
     need to strip out. Additionally the marker could of course be spread out
     over 5 different data chunks. */
  for(i = 0; i < nread; i++) {
    size_t prev = pop3c->eob;

    switch(str[i]) {
    case 0x0d:
      if(pop3c->eob == 0) {
        pop3c->eob++;

        if(i) {
          /* Write out the body part that didn't match */
          result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                                     i - last);

          if(result)
            return result;

          last = i;
        }
      }
      else if(pop3c->eob == 3)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 0 or 3 then restart the
           pattern matching */
        pop3c->eob = 1;
      break;

    case 0x0a:
      if(pop3c->eob == 1 || pop3c->eob == 4)
        pop3c->eob++;
      else
        /* If the character match wasn't at position 1 or 4 then start the
           search again */
        pop3c->eob = 0;
      break;

    case 0x2e:
      if(pop3c->eob == 2)
        pop3c->eob++;
      else if(pop3c->eob == 3) {
        /* We have an extra dot after the CRLF which we need to strip off */
        strip_dot = TRUE;
        pop3c->eob = 0;
      }
      else
        /* If the character match wasn't at position 2 then start the search
           again */
        pop3c->eob = 0;
      break;

    default:
      pop3c->eob = 0;
      break;
    }

    /* Did we have a partial match which has subsequently failed? */
    if(prev && prev >= pop3c->eob) {
      /* Strip can only be non-zero for the very first mismatch after CRLF
         and then both prev and strip are equal and nothing will be output
         below */
      while(prev && pop3c->strip) {
        prev--;
        pop3c->strip--;
      }

      if(prev) {
        /* If the partial match was the CRLF and dot then only write the CRLF
           as the server would have inserted the dot */
        result = Curl_client_write(conn, CLIENTWRITE_BODY, (char*)POP3_EOB,
                                   strip_dot ? prev - 1 : prev);

        if(result)
          return result;

        last = i;
        strip_dot = FALSE;
      }
    }
  }

  if(pop3c->eob == POP3_EOB_LEN) {
    /* We have a full match so the transfer is done, however we must transfer
    the CRLF at the start of the EOB as this is considered to be part of the
    message as per RFC-1939, sect. 3 */
    result = Curl_client_write(conn, CLIENTWRITE_BODY, (char *)POP3_EOB, 2);

    k->keepon &= ~KEEP_RECV;
    pop3c->eob = 0;

    return result;
  }

  if(pop3c->eob)
    /* While EOB is matching nothing should be output */
    return CURLE_OK;

  if(nread - last) {
    result = Curl_client_write(conn, CLIENTWRITE_BODY, &str[last],
                               nread - last);
  }

  return result;
}